

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O1

void __thiscall
SemanticAnalyzerRun::onExitFunctionDeclarationExpressionAstNode
          (SemanticAnalyzerRun *this,FunctionDeclarationExpressionAstNode *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  string local_48;
  
  sVar2 = this->functionDept;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Expected a non zero function dept when calling onExitFunctionDeclarationExpressionAstNode"
             ,"");
  Error::assertWithPanic(sVar2 != 0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this->functionDept = this->functionDept - 1;
  uVar3 = (this->inLoopState)._M_h._M_bucket_count;
  uVar4 = (ulong)node % uVar3;
  p_Var5 = (this->inLoopState)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var5->_M_nxt, p_Var6 = p_Var5,
     (FunctionDeclarationExpressionAstNode *)p_Var5->_M_nxt[1]._M_nxt != node)) {
    while (p_Var5 = p_Var7, p_Var7 = p_Var5->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var7[1]._M_nxt % uVar3 != uVar4) ||
         (p_Var6 = p_Var5, (FunctionDeclarationExpressionAstNode *)p_Var7[1]._M_nxt == node))
      goto LAB_0011120b;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0011120b:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var6->_M_nxt;
  }
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Could not find a key in inLoopState map for function declaration",
             "");
  Error::assertWithPanic(p_Var7 != (_Hash_node_base *)0x0,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this->inLoop = *(bool *)&p_Var7[2]._M_nxt;
  popScope(this);
  return;
}

Assistant:

void onExitFunctionDeclarationExpressionAstNode(FunctionDeclarationExpressionAstNode* node) noexcept override {
    Error::assertWithPanic(
      this->functionDept != 0,
      "Expected a non zero function dept when calling onExitFunctionDeclarationExpressionAstNode");

    this->functionDept--;

    auto search = this->inLoopState.find(node);

    Error::assertWithPanic(
      search != this->inLoopState.end(),
      "Could not find a key in inLoopState map for function declaration");

    this->inLoop = search->second;

    this->popScope();
  }